

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaParseNewDocWithContext
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaPtr schema,xmlSchemaBucketPtr_conflict bucket)

{
  int *flags;
  byte *pbVar1;
  uint uVar2;
  xmlSchemaConstructionCtxtPtr pxVar3;
  _xmlSchemaAnnot *p_Var4;
  _xmlSchemaAnnot *p_Var5;
  int iVar6;
  int iVar7;
  xmlNodePtr pxVar8;
  xmlAttrPtr pxVar9;
  xmlSchemaTypePtr pxVar10;
  xmlNodePtr pxVar11;
  _xmlSchemaType *p_Var12;
  xmlSchemaAnnotPtr pxVar13;
  xmlSchemaTypePtr pxVar14;
  _xmlSchemaType *schemaLocation_00;
  xmlSchemaTypePtr pxVar15;
  xmlChar *pxVar16;
  xmlSchemaTypePtr pxVar17;
  xmlSchemaAttributePtr_conflict pxVar18;
  char *type;
  xmlChar *name;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlChar *name_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar19;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlChar *name_01;
  long lVar20;
  long lVar21;
  xmlParserErrors error;
  char *in_R8;
  char *in_R9;
  xmlSchemaAnnotPtr *uri;
  xmlChar *namespaceName;
  xmlChar *schemaLocation;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff50;
  _xmlSchemaType *in_stack_ffffffffffffff58;
  xmlSchemaBucketPtr_conflict *in_stack_ffffffffffffff60;
  int local_7c;
  _xmlSchemaType *local_68;
  _xmlSchemaType *local_60;
  xmlSchemaTypePtr local_58;
  xmlSchemaBucketPtr_conflict local_50;
  int local_44;
  xmlDocPtr local_40;
  xmlSchemaBucketPtr_conflict local_38;
  
  pxVar3 = pctxt->constructor;
  local_38 = pxVar3->bucket;
  flags = &schema->flags;
  uVar2 = schema->flags;
  if ((uVar2 & 0x1ff) != 0) {
    *flags = uVar2 & 0xfffffe00;
  }
  local_40 = schema->doc;
  type = (char *)bucket->doc;
  schema->doc = (xmlDocPtr)type;
  pctxt->schema = schema;
  pxVar16 = bucket->targetNamespace;
  pctxt->targetNamespace = pxVar16;
  pxVar3->bucket = bucket;
  if ((pxVar16 != (xmlChar *)0x0) &&
     (iVar6 = xmlStrEqual(pxVar16,(xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0)) {
    pctxt->isS4S = 1;
  }
  bucket->parsed = bucket->parsed + 1;
  pxVar8 = xmlDocGetRootElement(bucket->doc);
  iVar6 = pctxt->nberrors;
  local_7c = xmlSchemaPValAttrID(pctxt,pxVar8,name);
  if (local_7c == -1) {
LAB_0018dce1:
    local_7c = -1;
    goto LAB_0018dcea;
  }
  pxVar9 = xmlSchemaGetPropNode(pxVar8,"targetNamespace");
  if (pxVar9 == (xmlAttrPtr)0x0) {
LAB_0018d4ec:
    pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar8,"elementFormDefault");
    if (pxVar11 != (xmlNodePtr)0x0) {
      p_Var12 = (_xmlSchemaType *)xmlSchemaGetNodeContent(pctxt,pxVar11);
      local_7c = 1;
      iVar7 = xmlSchemaPValAttrFormDefault((xmlChar *)p_Var12,flags,1);
      if (iVar7 == 0) {
        local_7c = 0;
      }
      else {
        in_stack_ffffffffffffff48 = (char *)0x0;
        in_stack_ffffffffffffff50 = 0;
        in_R8 = "(qualified | unqualified)";
        type = (char *)0x0;
        xmlSchemaPSimpleTypeErr
                  (pctxt,XML_SCHEMAP_ELEMFORMDEFAULT_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",(char *)p_Var12,
                   (xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                   (xmlChar *)in_stack_ffffffffffffff60);
        in_R9 = (char *)p_Var12;
      }
    }
    pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar8,"attributeFormDefault");
    if (pxVar11 != (xmlNodePtr)0x0) {
      p_Var12 = (_xmlSchemaType *)xmlSchemaGetNodeContent(pctxt,pxVar11);
      iVar7 = xmlSchemaPValAttrFormDefault((xmlChar *)p_Var12,flags,2);
      if (iVar7 == 0) {
        local_7c = 0;
      }
      else {
        in_stack_ffffffffffffff48 = (char *)0x0;
        in_stack_ffffffffffffff50 = 0;
        in_R8 = "(qualified | unqualified)";
        type = (char *)0x0;
        xmlSchemaPSimpleTypeErr
                  (pctxt,XML_SCHEMAP_ATTRFORMDEFAULT_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                   (xmlNodePtr)0x0,(xmlSchemaTypePtr)"(qualified | unqualified)",(char *)p_Var12,
                   (xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                   (xmlChar *)in_stack_ffffffffffffff60);
        local_7c = 1;
        in_R9 = (char *)p_Var12;
      }
    }
    pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar8,"finalDefault");
    if (pxVar11 != (xmlNodePtr)0x0) {
      p_Var12 = (_xmlSchemaType *)xmlSchemaGetNodeContent(pctxt,pxVar11);
      in_stack_ffffffffffffff48 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0x20);
      type = (char *)0x8;
      in_R8 = (char *)0xffffffff;
      in_R9 = (char *)0x10;
      local_7c = xmlSchemaPValAttrBlockFinal
                           ((xmlChar *)p_Var12,flags,4,8,-1,0x10,0x20,in_stack_ffffffffffffff50);
      if (local_7c == -1) goto LAB_0018dcea;
      if (local_7c != 0) {
        in_stack_ffffffffffffff48 = (char *)0x0;
        in_stack_ffffffffffffff50 = 0;
        in_R8 = "(#all | List of (extension | restriction | list | union))";
        type = (char *)0x0;
        xmlSchemaPSimpleTypeErr
                  (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                   (xmlNodePtr)0x0,
                   (xmlSchemaTypePtr)"(#all | List of (extension | restriction | list | union))",
                   (char *)p_Var12,(xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                   (xmlChar *)in_stack_ffffffffffffff60);
        local_7c = 1;
        in_R9 = (char *)p_Var12;
      }
    }
    pxVar11 = (xmlNodePtr)xmlSchemaGetPropNode(pxVar8,"blockDefault");
    if (pxVar11 != (xmlNodePtr)0x0) {
      p_Var12 = (_xmlSchemaType *)xmlSchemaGetNodeContent(pctxt,pxVar11);
      in_stack_ffffffffffffff48 =
           (char *)CONCAT44((int)((ulong)in_stack_ffffffffffffff48 >> 0x20),0xffffffff);
      type = (char *)0x80;
      in_R8 = (char *)0x100;
      in_R9 = (char *)0xffffffff;
      local_7c = xmlSchemaPValAttrBlockFinal
                           ((xmlChar *)p_Var12,flags,0x40,0x80,0x100,-1,-1,in_stack_ffffffffffffff50
                           );
      if (local_7c == -1) goto LAB_0018dcea;
      if (local_7c != 0) {
        in_stack_ffffffffffffff48 = (char *)0x0;
        in_R8 = "(#all | List of (extension | restriction | substitution))";
        type = (char *)0x0;
        xmlSchemaPSimpleTypeErr
                  (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar11,
                   (xmlNodePtr)0x0,
                   (xmlSchemaTypePtr)"(#all | List of (extension | restriction | substitution))",
                   (char *)p_Var12,(xmlChar *)0x0,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                   (xmlChar *)in_stack_ffffffffffffff60);
        local_7c = 1;
        in_R9 = (char *)p_Var12;
      }
    }
  }
  else {
    pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
    type = (char *)0x0;
    local_7c = xmlSchemaPValAttrNode
                         (pctxt,(xmlSchemaBasicItemPtr)pxVar9,(xmlAttrPtr)pxVar10,
                          (xmlSchemaTypePtr)0x0,(xmlChar **)in_R8);
    if (local_7c == -1) goto LAB_0018dcea;
    if (local_7c == 0) goto LAB_0018d4ec;
    pctxt->stop = 0xbdd;
  }
  local_44 = pctxt->nberrors;
  if (iVar6 != local_44) {
    local_7c = pctxt->err;
  }
  if (local_7c == 0) {
    pxVar10 = (xmlSchemaTypePtr)pxVar8->children;
    if (pxVar10 == (xmlSchemaTypePtr)0x0) {
      local_7c = 0;
    }
    else {
      local_7c = 0;
      do {
        if ((pxVar10->node == (xmlNodePtr)0x0) ||
           (((iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"include"), iVar6 == 0 ||
             (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar6 == 0)) &&
            ((pxVar10->node == (xmlNodePtr)0x0 ||
             (((iVar6 = xmlStrEqual(pxVar10->name,"import"), iVar6 == 0 ||
               (iVar6 = xmlStrEqual(pxVar10->node->name,
                                    (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) &&
              ((pxVar10->node == (xmlNodePtr)0x0 ||
               (((iVar6 = xmlStrEqual(pxVar10->name,"redefine"), iVar6 == 0 ||
                 (iVar6 = xmlStrEqual(pxVar10->node->name,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0))
                && ((pxVar10->node == (xmlNodePtr)0x0 ||
                    ((iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"annotation"), iVar6 == 0 ||
                     (iVar6 = xmlStrEqual(pxVar10->node->name,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0
                     )))))))))))))))) goto LAB_0018dd2c;
        if (pxVar10->node != (xmlNodePtr)0x0) {
          iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"annotation");
          if ((iVar6 == 0) ||
             (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
             , iVar6 == 0)) {
            if (pxVar10->node != (xmlNodePtr)0x0) {
              iVar6 = xmlStrEqual(pxVar10->name,"import");
              if ((iVar6 == 0) ||
                 (iVar6 = xmlStrEqual(pxVar10->node->name,
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0)) {
                if (pxVar10->node != (xmlNodePtr)0x0) {
                  iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"include");
                  if ((iVar6 == 0) ||
                     (iVar6 = xmlStrEqual(pxVar10->node->name,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 == 0
                     )) {
                    if ((pxVar10->node == (xmlNodePtr)0x0) ||
                       ((iVar6 = xmlStrEqual(pxVar10->name,"redefine"), iVar6 == 0 ||
                        (iVar6 = xmlStrEqual(pxVar10->node->name,
                                             (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                        iVar6 == 0)))) goto LAB_0018db24;
                    iVar6 = pctxt->nberrors;
                    type = (char *)0x3;
                  }
                  else {
                    iVar6 = pctxt->nberrors;
                    type = (char *)0x2;
                  }
                  local_7c = xmlSchemaParseIncludeOrRedefine
                                       (pctxt,schema,(xmlNodePtr)pxVar10,(int)type);
                  if (local_7c == -1) goto LAB_0018dce1;
                  if ((pctxt->stop != 0) || (iVar6 != pctxt->nberrors)) break;
                }
              }
              else {
                iVar6 = pctxt->nberrors;
                local_68 = (_xmlSchemaType *)0x0;
                local_60 = (_xmlSchemaType *)0x0;
                local_50 = (xmlSchemaBucketPtr_conflict)0x0;
                lVar20._0_4_ = pxVar10->flags;
                lVar20._4_4_ = pxVar10->contentType;
                for (; lVar20 != 0; lVar20 = *(long *)(lVar20 + 0x30)) {
                  if (*(long *)(lVar20 + 0x48) == 0) {
                    iVar7 = xmlStrEqual(*(xmlChar **)(lVar20 + 0x10),"id");
                    if (((iVar7 == 0) &&
                        (iVar7 = xmlStrEqual(*(xmlChar **)(lVar20 + 0x10),"namespace"), iVar7 == 0))
                       && (iVar7 = xmlStrEqual(*(xmlChar **)(lVar20 + 0x10),"schemaLocation"),
                          pxVar19 = extraout_RDX_00, iVar7 == 0)) goto LAB_0018d90b;
                  }
                  else {
                    iVar7 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar20 + 0x48) + 0x10),
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                    pxVar19 = extraout_RDX;
                    if (iVar7 != 0) {
LAB_0018d90b:
                      xmlSchemaPIllegalAttrErr
                                (pctxt,(xmlParserErrors)lVar20,pxVar19,(xmlAttrPtr)type);
                    }
                  }
                }
                pxVar14 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                iVar7 = xmlSchemaPValAttr(pctxt,(xmlSchemaBasicItemPtr)pxVar10,(xmlNodePtr)0x1e0035,
                                          (char *)pxVar14,(xmlSchemaTypePtr)&local_68,
                                          (xmlChar **)in_R9);
                type = (char *)xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                if (iVar7 == 0) {
                  iVar7 = xmlSchemaPValAttr(pctxt,(xmlSchemaBasicItemPtr)pxVar10,
                                            (xmlNodePtr)0x1e0138,type,(xmlSchemaTypePtr)&local_60,
                                            (xmlChar **)in_R9);
                  if (iVar7 != 0) {
                    type = (char *)xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                    in_stack_ffffffffffffff48 = (char *)0x0;
                    in_R8 = (char *)0x0;
                    in_R9 = (char *)local_60;
                    xmlSchemaPSimpleTypeErr
                              (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                               (xmlSchemaBasicItemPtr)pxVar10,(xmlNodePtr)type,(xmlSchemaTypePtr)0x0
                               ,(char *)local_60,(xmlChar *)0x0,(char *)0x0,
                               (xmlChar *)in_stack_ffffffffffffff58,
                               (xmlChar *)in_stack_ffffffffffffff60);
                    local_7c = pctxt->err;
                    goto LAB_0018dafb;
                  }
                  pxVar8 = (xmlNodePtr)pxVar10->id;
                  if ((pxVar8 != (xmlNodePtr)0x0) &&
                     (((pxVar8->ns == (xmlNs *)0x0 ||
                       (iVar7 = xmlStrEqual(pxVar8->name,(xmlChar *)"annotation"), iVar7 == 0)) ||
                      ((iVar7 = xmlStrEqual(pxVar8->ns->href,
                                            (xmlChar *)"http://www.w3.org/2001/XMLSchema"),
                       iVar7 == 0 || (pxVar8 = pxVar8->next, pxVar8 != (_xmlNode *)0x0)))))) {
                    xmlSchemaPContentErr
                              (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar10
                               ,pxVar8,(xmlNodePtr)0x0,"(annotation?)",in_stack_ffffffffffffff48);
                  }
                  p_Var12 = (_xmlSchemaType *)pctxt->constructor->bucket->origTargetNamespace;
                  if (local_68 == (_xmlSchemaType *)0x0) {
                    if (p_Var12 == (_xmlSchemaType *)0x0) {
                      error = XML_SCHEMAP_SRC_IMPORT_1_2;
                      in_R8 = 
                      "The attribute \'namespace\' must be existent if the importing schema has no target namespace"
                      ;
                      p_Var12 = (_xmlSchemaType *)0x0;
                      goto LAB_0018dcc7;
                    }
                  }
                  else {
                    iVar7 = xmlStrEqual((xmlChar *)p_Var12,(xmlChar *)local_68);
                    if (iVar7 != 0) {
                      error = XML_SCHEMAP_SRC_IMPORT_1_1;
                      in_R8 = 
                      "The value of the attribute \'namespace\' must not match the target namespace \'%s\' of the importing schema"
                      ;
LAB_0018dcc7:
                      in_stack_ffffffffffffff48 = (char *)0x0;
                      type = (char *)pxVar10;
                      xmlSchemaPCustomErrExt
                                (pctxt,error,(xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)pxVar10,in_R8,
                                 (xmlChar *)p_Var12,(xmlChar *)0x0,(xmlChar *)0x0);
                      in_R9 = (char *)p_Var12;
                      goto LAB_0018da06;
                    }
                  }
                  if (local_60 == (_xmlSchemaType *)0x0) {
                    schemaLocation_00 = (_xmlSchemaType *)0x0;
                  }
                  else {
                    schemaLocation_00 =
                         (_xmlSchemaType *)
                         xmlSchemaBuildAbsoluteURI
                                   (pctxt->dict,(xmlChar *)local_60,(xmlNodePtr)pxVar10);
                    local_60 = schemaLocation_00;
                  }
                  in_stack_ffffffffffffff60 = &local_50;
                  type = (char *)0x0;
                  in_R8 = (char *)0x0;
                  in_R9 = (char *)0x0;
                  in_stack_ffffffffffffff48 = (char *)pxVar10;
                  in_stack_ffffffffffffff58 = local_68;
                  local_7c = xmlSchemaAddSchemaDoc
                                       (pctxt,1,(xmlChar *)schemaLocation_00,(xmlDocPtr)0x0,
                                        (char *)0x0,0,(xmlNodePtr)pxVar10,(xmlChar *)p_Var12,
                                        (xmlChar *)local_68,in_stack_ffffffffffffff60);
                  if (local_7c != 0) goto LAB_0018dafb;
                  type = (char *)CONCAT71((int7)((ulong)type >> 8),
                                          local_60 != (_xmlSchemaType *)0x0 &&
                                          local_50 == (xmlSchemaBucketPtr_conflict)0x0);
                  in_R8 = (char *)local_60;
                  if (local_60 != (_xmlSchemaType *)0x0 &&
                      local_50 == (xmlSchemaBucketPtr_conflict)0x0) {
                    in_stack_ffffffffffffff48 = (char *)0x0;
                    type = "Failed to locate a schema at location \'%s\'. Skipping the import";
                    in_R9 = (char *)0x0;
                    xmlSchemaCustomWarning
                              ((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_WARN_UNLOCATED_SCHEMA,
                               (xmlNodePtr)pxVar10,
                               (xmlSchemaTypePtr)
                               "Failed to locate a schema at location \'%s\'. Skipping the import",
                               (char *)local_60,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)p_Var12);
                  }
                  if (((local_50 != (xmlSchemaBucketPtr_conflict)0x0) &&
                      (local_50->doc != (xmlDocPtr)0x0)) && (local_50->parsed == 0)) {
                    local_7c = xmlSchemaParseNewDoc(pctxt,schema,local_50);
                    goto LAB_0018dafb;
                  }
                  local_7c = 0;
                }
                else {
                  in_stack_ffffffffffffff48 = (char *)0x0;
                  in_R8 = (char *)0x0;
                  in_R9 = (char *)local_68;
                  xmlSchemaPSimpleTypeErr
                            (pctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)pxVar10
                             ,(xmlNodePtr)type,(xmlSchemaTypePtr)0x0,(char *)local_68,(xmlChar *)0x0
                             ,(char *)0x0,(xmlChar *)in_stack_ffffffffffffff58,
                             (xmlChar *)in_stack_ffffffffffffff60);
LAB_0018da06:
                  local_7c = pctxt->err;
LAB_0018dafb:
                  if (local_7c == -1) goto LAB_0018dce1;
                }
                if ((pctxt->stop != 0) || (iVar6 != pctxt->nberrors)) break;
              }
            }
          }
          else {
            pxVar13 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar10,1);
            if (schema->annot == (xmlSchemaAnnotPtr)0x0) {
              schema->annot = pxVar13;
            }
            else if (pxVar13 != (xmlSchemaAnnotPtr)0x0) {
              p_Var4 = pxVar13->next;
              (*xmlFree)(pxVar13);
              while (p_Var4 != (_xmlSchemaAnnot *)0x0) {
                p_Var5 = p_Var4->next;
                (*xmlFree)(p_Var4);
                p_Var4 = p_Var5;
              }
            }
          }
        }
LAB_0018db24:
        pxVar10 = (xmlSchemaTypePtr)pxVar10->annot;
      } while (pxVar10 != (xmlSchemaTypePtr)0x0);
LAB_0018e578:
      pctxt->ctxtType = (xmlSchemaTypePtr)0x0;
      if ((local_44 != pctxt->nberrors) && (local_7c = pctxt->err, local_7c == 0)) {
        local_7c = pctxt->err;
      }
    }
  }
LAB_0018dcea:
  pctxt->constructor->bucket = local_38;
  schema->doc = local_40;
  schema->flags = uVar2;
  return local_7c;
LAB_0018dd2c:
  if (pxVar10->node == (xmlNodePtr)0x0) {
LAB_0018e0e3:
    pxVar14 = (xmlSchemaTypePtr)pxVar10->refNs;
    in_R9 = 
    "((include | import | redefine | annotation)*, (((simpleType | complexType | group | attributeGroup) | element | attribute | notation), annotation*)*)"
    ;
    pxVar15 = pxVar10;
LAB_0018e0fc:
    in_R8 = (char *)0x0;
    xmlSchemaPContentErr
              (pctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar14,
               (xmlNodePtr)pxVar15,(xmlNodePtr)0x0,in_R9,in_stack_ffffffffffffff48);
    type = (char *)pxVar15;
  }
  else {
    iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"complexType");
    if ((iVar6 != 0) &&
       (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 != 0)) {
      type = &DAT_00000001;
      xmlSchemaParseComplexType(pctxt,schema,(xmlNodePtr)pxVar10,1);
      goto LAB_0018e101;
    }
    if (pxVar10->node == (xmlNodePtr)0x0) goto LAB_0018e0e3;
    iVar6 = xmlStrEqual(pxVar10->name,"simpleType");
    if ((iVar6 != 0) &&
       (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 != 0)) {
      type = &DAT_00000001;
      xmlSchemaParseSimpleType(pctxt,schema,(xmlNodePtr)pxVar10,1);
      goto LAB_0018e101;
    }
    if (pxVar10->node == (xmlNodePtr)0x0) goto LAB_0018e0e3;
    iVar6 = xmlStrEqual(pxVar10->name,"element");
    if ((iVar6 != 0) &&
       (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 != 0)) {
      type = (char *)0x0;
      in_R8 = &DAT_00000001;
      xmlSchemaParseElement(pctxt,schema,(xmlNodePtr)pxVar10,(int *)0x0,1);
      goto LAB_0018e101;
    }
    if (pxVar10->node == (xmlNodePtr)0x0) goto LAB_0018e0e3;
    iVar6 = xmlStrEqual(pxVar10->name,"attribute");
    pxVar14 = pxVar10;
    if ((iVar6 == 0) ||
       (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 == 0)) {
      if (pxVar10->node == (xmlNodePtr)0x0) goto LAB_0018e0e3;
      iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"attributeGroup");
      if ((iVar6 == 0) ||
         (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar6 == 0)) {
        if (pxVar10->node == (xmlNodePtr)0x0) goto LAB_0018e0e3;
        iVar6 = xmlStrEqual(pxVar10->name,"group");
        if ((iVar6 == 0) ||
           (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar6 == 0)) {
          if ((pxVar10->node == (xmlNodePtr)0x0) ||
             ((iVar6 = xmlStrEqual(pxVar10->name,"notation"), iVar6 == 0 ||
              (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"
                                  ), iVar6 == 0)))) goto LAB_0018e0e3;
          p_Var12 = (_xmlSchemaType *)xmlSchemaGetProp(pctxt,(xmlNodePtr)pxVar10,"name");
          if (p_Var12 == (_xmlSchemaType *)0x0) {
            in_stack_ffffffffffffff48 = (char *)0x0;
            in_stack_ffffffffffffff58 = (_xmlSchemaType *)0x0;
            type = (char *)0x2;
            xmlSchemaPErrFull(pctxt,(xmlNodePtr)pxVar10,0x6bb,XML_ERR_ERROR,in_R8,(int)in_R9,
                              (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,
                              (int)in_stack_ffffffffffffff60,"Notation has no name\n",0,0);
          }
          else {
            pxVar16 = pctxt->targetNamespace;
            pxVar17 = (xmlSchemaTypePtr)(*xmlMalloc)(0x28);
            if (pxVar17 == (xmlSchemaTypePtr)0x0) {
              pctxt->nberrors = pctxt->nberrors + 1;
              pctxt->err = 2;
              type = (char *)0x10;
              in_R8 = (char *)0x0;
              xmlRaiseMemoryError(pctxt->serror,pctxt->error,pctxt->errCtxt,0x10,(xmlError *)0x0);
            }
            else {
              *(undefined8 *)pxVar17 = 0;
              pxVar17->next = (_xmlSchemaType *)0x0;
              pxVar17->name = (xmlChar *)0x0;
              pxVar17->id = (xmlChar *)0x0;
              pxVar17->type = XML_SCHEMA_TYPE_NOTATION;
              pxVar17->next = p_Var12;
              pxVar17->ref = pxVar16;
              type = (char *)pctxt->constructor;
              iVar6 = xmlSchemaAddItemSize
                                ((xmlSchemaItemListPtr *)(((xmlSchemaTypePtr)type)->ref + 0x40),5,
                                 pxVar17);
              if (iVar6 < 0) {
                pctxt->nberrors = pctxt->nberrors + 1;
                pctxt->err = 2;
                type = (char *)0x10;
                in_R8 = (char *)0x0;
                xmlRaiseMemoryError(pctxt->serror,pctxt->error,pctxt->errCtxt,0x10,(xmlError *)0x0);
                (*xmlFree)(pxVar17);
              }
              else {
                xmlSchemaPValAttrID(pctxt,(xmlNodePtr)pxVar10,name_00);
                pxVar15 = (xmlSchemaTypePtr)pxVar10->id;
                if (pxVar15 != (xmlSchemaTypePtr)0x0) {
                  if (((pxVar15->node != (xmlNodePtr)0x0) &&
                      (iVar6 = xmlStrEqual(pxVar15->name,(xmlChar *)"annotation"), iVar6 != 0)) &&
                     (iVar6 = xmlStrEqual(pxVar15->node->name,
                                          (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0
                     )) {
                    pxVar13 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar15,1);
                    pxVar17->name = (xmlChar *)pxVar13;
                    pxVar15 = (xmlSchemaTypePtr)pxVar15->annot;
                    type = (char *)pxVar17;
                    if (pxVar15 == (xmlSchemaTypePtr)0x0) goto LAB_0018e101;
                  }
                  in_R9 = "(annotation?)";
                  goto LAB_0018e0fc;
                }
              }
            }
          }
        }
        else {
          xmlSchemaParseModelGroupDefinition(pctxt,schema,(xmlNodePtr)pxVar10);
        }
      }
      else {
        xmlSchemaParseAttributeGroupDefinition(pctxt,schema,(xmlNodePtr)pxVar10);
      }
    }
    else {
      pxVar9 = xmlSchemaGetPropNode((xmlNodePtr)pxVar10,"name");
      if (pxVar9 == (xmlAttrPtr)0x0) {
        xmlSchemaPMissingAttrErr
                  (pctxt,(xmlParserErrors)pxVar10,(xmlSchemaBasicItemPtr)0x1c9054,(xmlNodePtr)type,
                   in_R8,in_R9);
      }
      else {
        pxVar15 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
        type = (char *)&local_68;
        iVar6 = xmlSchemaPValAttrNode
                          (pctxt,(xmlSchemaBasicItemPtr)pxVar9,(xmlAttrPtr)pxVar15,
                           (xmlSchemaTypePtr)type,(xmlChar **)in_R8);
        if (iVar6 == 0) {
          iVar6 = xmlStrEqual((xmlChar *)local_68,"xmlns");
          if (iVar6 == 0) {
            iVar6 = xmlStrEqual(pctxt->targetNamespace,
                                (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance");
            if (iVar6 != 0) {
              in_stack_ffffffffffffff48 = (char *)0x0;
              in_stack_ffffffffffffff58 = (_xmlSchemaType *)0x0;
              in_R9 = "http://www.w3.org/2001/XMLSchema-instance";
              xmlSchemaCustomErr4((xmlSchemaAbstractCtxtPtr)pctxt,XML_SCHEMAP_NO_XSI,
                                  (xmlNodePtr)pxVar10,(xmlSchemaBasicItemPtr)0x0,
                                  "The target namespace must not match \'%s\'",
                                  (xmlChar *)"http://www.w3.org/2001/XMLSchema-instance",
                                  (xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            }
            in_R8 = &DAT_00000001;
            type = (char *)pxVar10;
            pxVar15 = (xmlSchemaTypePtr)
                      xmlSchemaAddAttribute
                                (pctxt,(xmlSchemaPtr)local_68,pctxt->targetNamespace,
                                 (xmlChar *)pxVar10,(xmlNodePtr)&DAT_00000001,(int)in_R9);
            if (pxVar15 != (xmlSchemaTypePtr)0x0) {
              *(byte *)&pxVar15->facets = *(byte *)&pxVar15->facets | 1;
              lVar21._0_4_ = pxVar10->flags;
              lVar21._4_4_ = pxVar10->contentType;
              local_58 = pxVar15;
              for (; lVar21 != 0; lVar21 = *(long *)(lVar21 + 0x30)) {
                if (*(long *)(lVar21 + 0x48) == 0) {
                  iVar6 = xmlStrEqual(*(xmlChar **)(lVar21 + 0x10),"id");
                  if (((iVar6 == 0) &&
                      (iVar6 = xmlStrEqual(*(xmlChar **)(lVar21 + 0x10),"default"), iVar6 == 0)) &&
                     ((iVar6 = xmlStrEqual(*(xmlChar **)(lVar21 + 0x10),(xmlChar *)"fixed"),
                      iVar6 == 0 &&
                      ((iVar6 = xmlStrEqual(*(xmlChar **)(lVar21 + 0x10),"name"), iVar6 == 0 &&
                       (iVar6 = xmlStrEqual(*(xmlChar **)(lVar21 + 0x10),"type"),
                       pxVar19 = extraout_RDX_02, iVar6 == 0)))))) goto LAB_0018e254;
                }
                else {
                  iVar6 = xmlStrEqual(*(xmlChar **)(*(long *)(lVar21 + 0x48) + 0x10),
                                      (xmlChar *)"http://www.w3.org/2001/XMLSchema");
                  pxVar19 = extraout_RDX_01;
                  if (iVar6 != 0) {
LAB_0018e254:
                    xmlSchemaPIllegalAttrErr(pctxt,(xmlParserErrors)lVar21,pxVar19,(xmlAttrPtr)type)
                    ;
                  }
                }
              }
              in_R8 = (char *)&pxVar15->subtypes;
              uri = &pxVar15->annot;
              type = "type";
              in_R9 = (char *)uri;
              xmlSchemaPValAttrQName
                        (pctxt,schema,(xmlSchemaBasicItemPtr)pxVar10,(xmlNodePtr)0x1e0df4,in_R8,
                         (xmlChar **)uri,(xmlChar **)in_stack_ffffffffffffff48);
              xmlSchemaPValAttrID(pctxt,(xmlNodePtr)pxVar10,name_01);
              pxVar16 = xmlSchemaGetProp(pctxt,(xmlNodePtr)pxVar10,"fixed");
              pxVar15 = local_58;
              *(xmlChar **)&local_58->flags = pxVar16;
              if (pxVar16 != (xmlChar *)0x0) {
                pbVar1 = (byte *)((long)&local_58->facets + 1);
                *pbVar1 = *pbVar1 | 2;
              }
              pxVar17 = (xmlSchemaTypePtr)xmlSchemaGetPropNode((xmlNodePtr)pxVar10,"default");
              if (pxVar17 != (xmlSchemaTypePtr)0x0) {
                if (((ulong)pxVar15->facets & 0x200) == 0) {
                  pxVar16 = xmlSchemaGetNodeContent(pctxt,(xmlNodePtr)pxVar17);
                  *(xmlChar **)&pxVar15->flags = pxVar16;
                }
                else {
                  in_R8 = "default";
                  in_R9 = "fixed";
                  xmlSchemaPMutualExclAttrErr
                            (pctxt,XML_SCHEMAP_SRC_ATTRIBUTE_1,(xmlSchemaBasicItemPtr)pxVar15,
                             (xmlAttrPtr)pxVar17,"default","fixed");
                  type = (char *)pxVar17;
                }
              }
              pxVar15 = (xmlSchemaTypePtr)pxVar10->id;
              if (pxVar15 != (xmlSchemaTypePtr)0x0) {
                if (((pxVar15->node != (xmlNodePtr)0x0) &&
                    (iVar6 = xmlStrEqual(pxVar15->name,(xmlChar *)"annotation"), iVar6 != 0)) &&
                   (iVar6 = xmlStrEqual(pxVar15->node->name,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0))
                {
                  pxVar18 = (xmlSchemaAttributePtr_conflict)
                            xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar15,1);
                  local_58->attributes = pxVar18;
                  pxVar15 = (xmlSchemaTypePtr)pxVar15->annot;
                  type = (char *)local_58;
                  if (pxVar15 == (xmlSchemaTypePtr)0x0) goto LAB_0018e101;
                }
                if (((pxVar15->node != (xmlNodePtr)0x0) &&
                    (iVar6 = xmlStrEqual(pxVar15->name,"simpleType"), iVar6 != 0)) &&
                   (iVar6 = xmlStrEqual(pxVar15->node->name,
                                        (xmlChar *)"http://www.w3.org/2001/XMLSchema"), iVar6 != 0))
                {
                  if (*uri == (xmlSchemaAnnotPtr)0x0) {
                    pxVar17 = xmlSchemaParseSimpleType(pctxt,schema,(xmlNodePtr)pxVar15,0);
                    local_58->base = (xmlChar *)pxVar17;
                    type = (char *)local_58;
                  }
                  else {
                    in_R8 = 
                    "The attribute \'type\' and the <simpleType> child are mutually exclusive";
                    in_R9 = (char *)0x0;
                    type = (char *)pxVar15;
                    xmlSchemaPContentErr
                              (pctxt,XML_SCHEMAP_SRC_ATTRIBUTE_4,(xmlSchemaBasicItemPtr)pxVar10,
                               (xmlNodePtr)pxVar15,
                               (xmlNodePtr)
                               "The attribute \'type\' and the <simpleType> child are mutually exclusive"
                               ,(char *)0x0,in_stack_ffffffffffffff48);
                  }
                  pxVar15 = (xmlSchemaTypePtr)pxVar15->annot;
                  if (pxVar15 == (xmlSchemaTypePtr)0x0) goto LAB_0018e101;
                }
                in_R9 = "(annotation?, simpleType?)";
                goto LAB_0018e0fc;
              }
            }
          }
          else {
            type = (char *)xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
            in_stack_ffffffffffffff48 = "The value of the attribute must not match \'xmlns\'";
            in_R8 = (char *)0x0;
            in_R9 = (char *)0x0;
            xmlSchemaPSimpleTypeErr
                      (pctxt,XML_SCHEMAP_NO_XMLNS,(xmlSchemaBasicItemPtr)pxVar9,(xmlNodePtr)type,
                       (xmlSchemaTypePtr)0x0,(char *)0x0,
                       (xmlChar *)"The value of the attribute must not match \'xmlns\'",(char *)0x0,
                       (xmlChar *)in_stack_ffffffffffffff58,(xmlChar *)in_stack_ffffffffffffff60);
          }
        }
      }
    }
  }
LAB_0018e101:
  pxVar10 = (xmlSchemaTypePtr)pxVar10->annot;
  while( true ) {
    if (pxVar10 == (xmlSchemaTypePtr)0x0) goto LAB_0018e578;
    if (((pxVar10->node == (xmlNodePtr)0x0) ||
        (iVar6 = xmlStrEqual(pxVar10->name,(xmlChar *)"annotation"), iVar6 == 0)) ||
       (iVar6 = xmlStrEqual(pxVar10->node->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar6 == 0)) break;
    pxVar13 = xmlSchemaParseAnnotation(pctxt,(xmlNodePtr)pxVar10,1);
    if (schema->annot == (xmlSchemaAnnotPtr)0x0) {
      schema->annot = pxVar13;
    }
    else if (pxVar13 != (xmlSchemaAnnotPtr)0x0) {
      p_Var4 = pxVar13->next;
      (*xmlFree)(pxVar13);
      while (p_Var4 != (_xmlSchemaAnnot *)0x0) {
        p_Var5 = p_Var4->next;
        (*xmlFree)(p_Var4);
        p_Var4 = p_Var5;
      }
    }
    pxVar10 = (xmlSchemaTypePtr)pxVar10->annot;
  }
  goto LAB_0018dd2c;
}

Assistant:

static int
xmlSchemaParseNewDocWithContext(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaPtr schema,
		     xmlSchemaBucketPtr bucket)
{
    int oldFlags;
    xmlDocPtr oldDoc;
    xmlNodePtr node;
    int ret, oldErrs;
    xmlSchemaBucketPtr oldbucket = pctxt->constructor->bucket;

    /*
    * Save old values; reset the *main* schema.
    * URGENT TODO: This is not good; move the per-document information
    * to the parser. Get rid of passing the main schema to the
    * parsing functions.
    */
    oldFlags = schema->flags;
    oldDoc = schema->doc;
    if (schema->flags != 0)
	xmlSchemaClearSchemaDefaults(schema);
    schema->doc = bucket->doc;
    pctxt->schema = schema;
    /*
    * Keep the current target namespace on the parser *not* on the
    * main schema.
    */
    pctxt->targetNamespace = bucket->targetNamespace;
    WXS_CONSTRUCTOR(pctxt)->bucket = bucket;

    if ((bucket->targetNamespace != NULL) &&
	xmlStrEqual(bucket->targetNamespace, xmlSchemaNs)) {
	/*
	* We are parsing the schema for schemas!
	*/
	pctxt->isS4S = 1;
    }
    /* Mark it as parsed, even if parsing fails. */
    bucket->parsed++;
    /* Compile the schema doc. */
    node = xmlDocGetRootElement(bucket->doc);
    ret = xmlSchemaParseSchemaElement(pctxt, schema, node);
    if (ret != 0)
	goto exit;
    /* An empty schema; just get out. */
    if (node->children == NULL)
	goto exit;
    oldErrs = pctxt->nberrors;
    ret = xmlSchemaParseSchemaTopLevel(pctxt, schema, node->children);
    if (ret != 0)
	goto exit;
    /*
    * TODO: Not nice, but I'm not 100% sure we will get always an error
    * as a result of the above functions; so better rely on pctxt->err
    * as well.
    */
    if ((ret == 0) && (oldErrs != pctxt->nberrors)) {
	ret = pctxt->err;
	goto exit;
    }

exit:
    WXS_CONSTRUCTOR(pctxt)->bucket = oldbucket;
    /* Restore schema values. */
    schema->doc = oldDoc;
    schema->flags = oldFlags;
    return(ret);
}